

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O2

void mult_verify::MultVerifyUint8Uint8(void)

{
  byte bVar1;
  byte rhs;
  long lVar2;
  allocator local_51;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 2; lVar2 != 0x15b; lVar2 = lVar2 + 3) {
    bVar1 = *(byte *)(lVar2 + 0x18974e);
    rhs = *(byte *)(lVar2 + 0x18974f);
    if ((bool)(&uint8_uint8)[lVar2] != ((char)((ushort)((ushort)bVar1 * (ushort)rhs) >> 8) == '\0'))
    {
      std::__cxx11::string::string((string *)&si,"Error in case uint8_uint8: ",&local_51);
      err_msg<unsigned_int,unsigned_int>
                ((string *)&si,(uint)*(byte *)(lVar2 + 0x18974e),(uint)*(byte *)(lVar2 + 0x18974f),
                 (bool)(&uint8_uint8)[lVar2]);
      std::__cxx11::string::~string((string *)&si);
      bVar1 = *(byte *)(lVar2 + 0x18974e);
      rhs = *(byte *)(lVar2 + 0x18974f);
    }
    si.m_int = bVar1;
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator*=((SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&si,rhs);
    if ((&uint8_uint8)[lVar2] != '\x01') {
      std::__cxx11::string::string((string *)&si,"Error in case uint8_uint8 throw: ",&local_51);
      err_msg<unsigned_int,unsigned_int>
                ((string *)&si,(uint)*(byte *)(lVar2 + 0x18974e),(uint)*(byte *)(lVar2 + 0x18974f),
                 (bool)(&uint8_uint8)[lVar2]);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void MultVerifyUint8Uint8()
{
	size_t i;

	for( i = 0; i < COUNTOF(uint8_uint8); ++i )
	{
		std::uint8_t ret;
		if( SafeMultiply(uint8_uint8[i].x, uint8_uint8[i].y, ret) != uint8_uint8[i].fExpected )
		{
			//assert(false);
			err_msg( "Error in case uint8_uint8: ", (unsigned int)uint8_uint8[i].x, (unsigned int)uint8_uint8[i].y, uint8_uint8[i].fExpected );
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint8_t> si(uint8_uint8[i].x);
			si *= uint8_uint8[i].y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != uint8_uint8[i].fExpected )
		{
			err_msg( "Error in case uint8_uint8 throw: ", (unsigned int)uint8_uint8[i].x, (unsigned int)uint8_uint8[i].y, uint8_uint8[i].fExpected );
		}
	}
}